

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::CastTask::~CastTask(CastTask *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~CastTask((CastTask *)0x93b888);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

explicit CastTask(KnownSystemName knownNameId) : SystemTaskBase(knownNameId) {
        hasOutputArgs = true;
    }